

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF8ToUTF16BE(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  int iVar1;
  byte bVar3;
  uint uVar2;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  
  iVar4 = (int)out;
  iVar5 = (int)in;
  iVar1 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    if (in == (uchar *)0x0) {
      *outlen = 0;
      iVar5 = 0;
      iVar1 = 0;
    }
    else {
      if (0 < (long)*inlen) {
        pbVar6 = in + *inlen;
        pbVar7 = out + ((long)*outlen & 0xfffffffffffffffe);
        do {
          bVar3 = *in;
          if ((char)bVar3 < '\0') {
            if (bVar3 < 0xe0) {
              if (bVar3 < 0xc2) {
                iVar1 = -2;
                goto LAB_0012dfe2;
              }
              uVar11 = bVar3 & 0x1f;
              uVar10 = 0x80;
              lVar13 = 2;
            }
            else {
              lVar13 = 4 - (ulong)(bVar3 < 0xf0);
              uVar10 = 0x10000;
              if (bVar3 < 0xf0) {
                uVar10 = 0x800;
              }
              uVar11 = bVar3 & 0xf;
            }
            if (lVar13 <= (long)pbVar6 - (long)in) {
              lVar8 = 1;
              do {
                uVar12 = uVar11;
                iVar1 = -2;
                if ((in[lVar8] & 0xc0) != 0x80) goto LAB_0012dfe2;
                uVar2 = uVar12 << 6;
                uVar11 = in[lVar8] & 0x3f | uVar2;
                lVar8 = lVar8 + 1;
              } while (lVar13 != lVar8);
              if (((uVar10 <= uVar11) && (uVar2 < 0x110000)) && ((uVar12 & 0x3ffffe0) != 0x360)) {
                bVar3 = (byte)(uVar2 >> 8);
                if (uVar2 < 0x10000) {
                  if (out < pbVar7) {
                    *out = bVar3;
                    lVar8 = 2;
                    lVar9 = 1;
LAB_0012dfca:
                    out[lVar9] = (byte)uVar11;
                    out = out + lVar8;
                    in = in + lVar13;
                    goto LAB_0012dfd5;
                  }
                }
                else if (3 < (long)pbVar7 - (long)out) {
                  *out = (byte)(uVar11 - 0x10000 >> 0x12) | 0xd8;
                  out[1] = (byte)(uVar11 - 0x10000 >> 10);
                  out[2] = bVar3 & 3 | 0xdc;
                  lVar8 = 4;
                  lVar9 = 3;
                  goto LAB_0012dfca;
                }
LAB_0012e004:
                iVar1 = -3;
              }
              goto LAB_0012dfe2;
            }
            break;
          }
          if (pbVar7 <= out) goto LAB_0012e004;
          *out = 0;
          out[1] = bVar3;
          in = in + 1;
          out = out + 2;
LAB_0012dfd5:
        } while (in < pbVar6);
      }
      iVar1 = (int)out - iVar4;
LAB_0012dfe2:
      *outlen = (int)out - iVar4;
      iVar5 = (int)in - iVar5;
    }
    *inlen = iVar5;
  }
  return iVar1;
}

Assistant:

static int
UTF8ToUTF16BE(unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              void *vctxt ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend;
    unsigned char *outstart = out;
    unsigned char *outend;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    /* UTF-16BE has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + *inlen;
    outend = out + (*outlen & ~1);
    while (in < inend) {
        c = in[0];

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = 0;
            out[1] = c;
            in += 1;
            out += 2;
        } else {
            int i, len;
            unsigned min;

            if (c < 0xE0) {
                if (c < 0xC2) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c &= 0x1F;
                len = 2;
                min = 0x80;
            } else if (c < 0xF0) {
                c &= 0x0F;
                len = 3;
                min = 0x800;
            } else {
                c &= 0x0F;
                len = 4;
                min = 0x10000;
            }

            if (inend - in < len)
                break;

            for (i = 1; i < len; i++) {
                if ((in[i] & 0xC0) != 0x80) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c = (c << 6) | (in[i] & 0x3F);
            }

            if ((c < min) ||
                ((c >= 0xD800) && (c <= 0xDFFF)) ||
                (c > 0x10FFFF)) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }

            if (c < 0x10000) {
                if (out >= outend)
                    goto done;
                out[0] = c >> 8;
                out[1] = c & 0xFF;
                out += 2;
            } else {
                if (outend - out < 4)
                    goto done;
                c -= 0x10000;
                d = (c & 0x03FF) | 0xDC00;
                c = (c >> 10)    | 0xD800;
                out[0] = c >> 8;
                out[1] = c & 0xFF;
                out[2] = d >> 8;
                out[3] = d & 0xFF;
                out += 4;
            }

            in += len;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}